

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
          (TextureRenderer *this,int texUnit,float *texCoord,RenderParams *params)

{
  void **__return_storage_ptr__;
  SamplerType SVar1;
  code *pcVar2;
  RenderContext *context;
  deUint32 dVar3;
  undefined4 uVar4;
  float extraout_var;
  float *pfVar5;
  MessageBuilder *pMVar6;
  VertexArrayBinding *local_a78;
  PrimitiveList local_948;
  undefined1 local_92a;
  allocator<char> local_929;
  string local_928;
  allocator<char> local_901;
  string local_900;
  void **local_8e0;
  undefined1 local_8d8 [8];
  VertexArrayBinding vertexArrays [2];
  MessageBuilder local_830;
  MessageBuilder local_6b0;
  MessageBuilder local_530;
  MessageBuilder local_3b0;
  MessageBuilder local_220;
  deUint32 local_9c;
  ShaderProgram *pSStack_98;
  deUint32 prog;
  ShaderProgram *program;
  int numComps;
  Program progSpec;
  float position [16];
  undefined1 local_40 [6];
  bool logUniforms;
  bool useBias;
  Vec4 wCoord;
  Functions *gl;
  RenderParams *params_local;
  float *texCoord_local;
  TextureRenderer *pTStack_10;
  int texUnit_local;
  TextureRenderer *this_local;
  
  texCoord_local._4_4_ = texUnit;
  pTStack_10 = this;
  wCoord.m_data[2] = (float)(*this->m_renderCtx->_vptr_RenderContext[3])();
  wCoord.m_data[3] = extraout_var;
  if ((params->flags & 1) == 0) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_40,1.0);
  }
  else {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_40,&params->w);
  }
  position[0xf]._3_1_ = (params->flags & 2) != 0;
  position[0xf]._2_1_ = (params->flags & 8) != 0;
  pfVar5 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_40);
  numComps = (int)(*pfVar5 * -1.0);
  pfVar5 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_40);
  progSpec = (Program)(*pfVar5 * -1.0);
  position[0] = 0.0;
  pfVar5 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_40);
  position[1] = *pfVar5;
  pfVar5 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_40);
  position[2] = *pfVar5 * -1.0;
  pfVar5 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_40);
  position[3] = *pfVar5 * 1.0;
  position[4] = 0.0;
  pfVar5 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_40);
  position[5] = *pfVar5;
  pfVar5 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_40);
  position[6] = *pfVar5 * 1.0;
  pfVar5 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_40);
  position[7] = *pfVar5 * -1.0;
  position[8] = 0.0;
  pfVar5 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_40);
  position[9] = *pfVar5;
  pfVar5 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_40);
  position[10] = *pfVar5 * 1.0;
  pfVar5 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_40);
  position[0xb] = *pfVar5 * 1.0;
  position[0xc] = 0.0;
  pfVar5 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_40);
  position[0xd] = *pfVar5;
  program._4_4_ = PROGRAM_LAST;
  program._0_4_ = 0;
  if (params->texType == TEXTURETYPE_2D) {
    program._0_4_ = 2;
    switch(params->samplerType) {
    case SAMPLERTYPE_FLOAT:
      program._4_4_ = PROGRAM_2D_FLOAT;
      if ((position[0xf]._3_1_ & 1) != 0) {
        program._4_4_ = PROGRAM_2D_FLOAT_BIAS;
      }
      break;
    case SAMPLERTYPE_INT:
      program._4_4_ = PROGRAM_2D_INT;
      if ((position[0xf]._3_1_ & 1) != 0) {
        program._4_4_ = PROGRAM_2D_INT_BIAS;
      }
      break;
    case SAMPLERTYPE_UINT:
      program._4_4_ = PROGRAM_2D_UINT;
      if ((position[0xf]._3_1_ & 1) != 0) {
        program._4_4_ = PROGRAM_2D_UINT_BIAS;
      }
      break;
    case SAMPLERTYPE_SHADOW:
      program._4_4_ = PROGRAM_2D_SHADOW;
      if ((position[0xf]._3_1_ & 1) != 0) {
        program._4_4_ = PROGRAM_2D_SHADOW_BIAS;
      }
    }
  }
  else if (params->texType == TEXTURETYPE_1D) {
    program._0_4_ = 1;
    switch(params->samplerType) {
    case SAMPLERTYPE_FLOAT:
      program._4_4_ = PROGRAM_1D_FLOAT;
      if ((position[0xf]._3_1_ & 1) != 0) {
        program._4_4_ = PROGRAM_1D_FLOAT_BIAS;
      }
      break;
    case SAMPLERTYPE_INT:
      program._4_4_ = PROGRAM_1D_INT;
      if ((position[0xf]._3_1_ & 1) != 0) {
        program._4_4_ = PROGRAM_1D_INT_BIAS;
      }
      break;
    case SAMPLERTYPE_UINT:
      program._4_4_ = PROGRAM_1D_UINT;
      if ((position[0xf]._3_1_ & 1) != 0) {
        program._4_4_ = PROGRAM_1D_UINT_BIAS;
      }
      break;
    case SAMPLERTYPE_SHADOW:
      program._4_4_ = PROGRAM_1D_SHADOW;
      if ((position[0xf]._3_1_ & 1) != 0) {
        program._4_4_ = PROGRAM_1D_SHADOW_BIAS;
      }
    }
  }
  else if (params->texType == TEXTURETYPE_CUBE) {
    program._0_4_ = 3;
    switch(params->samplerType) {
    case SAMPLERTYPE_FLOAT:
      program._4_4_ = PROGRAM_CUBE_FLOAT;
      if ((position[0xf]._3_1_ & 1) != 0) {
        program._4_4_ = PROGRAM_CUBE_FLOAT_BIAS;
      }
      break;
    case SAMPLERTYPE_INT:
      program._4_4_ = PROGRAM_CUBE_INT;
      if ((position[0xf]._3_1_ & 1) != 0) {
        program._4_4_ = PROGRAM_CUBE_INT_BIAS;
      }
      break;
    case SAMPLERTYPE_UINT:
      program._4_4_ = PROGRAM_CUBE_UINT;
      if ((position[0xf]._3_1_ & 1) != 0) {
        program._4_4_ = PROGRAM_CUBE_UINT_BIAS;
      }
      break;
    case SAMPLERTYPE_SHADOW:
      program._4_4_ = PROGRAM_CUBE_SHADOW;
      if ((position[0xf]._3_1_ & 1) != 0) {
        program._4_4_ = PROGRAM_CUBE_SHADOW_BIAS;
      }
    }
  }
  else if (params->texType == TEXTURETYPE_3D) {
    program._0_4_ = 3;
    SVar1 = params->samplerType;
    if (SVar1 == SAMPLERTYPE_FLOAT) {
      program._4_4_ = PROGRAM_3D_FLOAT;
      if ((position[0xf]._3_1_ & 1) != 0) {
        program._4_4_ = PROGRAM_3D_FLOAT_BIAS;
      }
    }
    else if (SVar1 == SAMPLERTYPE_INT) {
      program._4_4_ = PROGRAM_3D_INT;
      if ((position[0xf]._3_1_ & 1) != 0) {
        program._4_4_ = PROGRAM_3D_INT_BIAS;
      }
    }
    else if ((SVar1 == SAMPLERTYPE_UINT) &&
            (program._4_4_ = PROGRAM_3D_UINT, (position[0xf]._3_1_ & 1) != 0)) {
      program._4_4_ = PROGRAM_3D_UINT_BIAS;
    }
  }
  else if (params->texType == TEXTURETYPE_2D_ARRAY) {
    program._0_4_ = 3;
    switch(params->samplerType) {
    case SAMPLERTYPE_FLOAT:
      program._4_4_ = PROGRAM_2D_ARRAY_FLOAT;
      break;
    case SAMPLERTYPE_INT:
      program._4_4_ = PROGRAM_2D_ARRAY_INT;
      break;
    case SAMPLERTYPE_UINT:
      program._4_4_ = PROGRAM_2D_ARRAY_UINT;
      break;
    case SAMPLERTYPE_SHADOW:
      program._4_4_ = PROGRAM_2D_ARRAY_SHADOW;
    }
  }
  else if (params->texType == TEXTURETYPE_CUBE_ARRAY) {
    program._0_4_ = 4;
    switch(params->samplerType) {
    case SAMPLERTYPE_FLOAT:
      program._4_4_ = PROGRAM_CUBE_ARRAY_FLOAT;
      break;
    case SAMPLERTYPE_INT:
      program._4_4_ = PROGRAM_CUBE_ARRAY_INT;
      break;
    case SAMPLERTYPE_UINT:
      program._4_4_ = PROGRAM_CUBE_ARRAY_UINT;
      break;
    case SAMPLERTYPE_SHADOW:
      program._4_4_ = PROGRAM_CUBE_ARRAY_SHADOW;
    }
  }
  else if (params->texType == TEXTURETYPE_1D_ARRAY) {
    program._0_4_ = 2;
    switch(params->samplerType) {
    case SAMPLERTYPE_FLOAT:
      program._4_4_ = PROGRAM_1D_ARRAY_FLOAT;
      break;
    case SAMPLERTYPE_INT:
      program._4_4_ = PROGRAM_1D_ARRAY_INT;
      break;
    case SAMPLERTYPE_UINT:
      program._4_4_ = PROGRAM_1D_ARRAY_UINT;
      break;
    case SAMPLERTYPE_SHADOW:
      program._4_4_ = PROGRAM_1D_ARRAY_SHADOW;
    }
  }
  else if (params->texType == TEXTURETYPE_BUFFER) {
    program._0_4_ = 1;
    SVar1 = params->samplerType;
    if (SVar1 == SAMPLERTYPE_FETCH_FLOAT) {
      program._4_4_ = PROGRAM_BUFFER_FLOAT;
    }
    else if (SVar1 == SAMPLERTYPE_FETCH_INT) {
      program._4_4_ = PROGRAM_BUFFER_INT;
    }
    else if (SVar1 == SAMPLERTYPE_FETCH_UINT) {
      program._4_4_ = PROGRAM_BUFFER_UINT;
    }
  }
  pSStack_98 = ProgramLibrary::getProgram(&this->m_programLibrary,program._4_4_);
  if ((params->flags & 4) != 0) {
    glu::operator<<(this->m_log,pSStack_98);
  }
  dVar3 = (**(code **)(wCoord.m_data._8_8_ + 0x800))();
  glu::checkError(dVar3,"Set vertex attributes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureTestUtil.cpp"
                  ,0x1b6);
  local_9c = glu::ShaderProgram::getProgram(pSStack_98);
  (**(code **)(wCoord.m_data._8_8_ + 0x1680))(local_9c);
  pcVar2 = *(code **)(wCoord.m_data._8_8_ + 0x14f0);
  uVar4 = (**(code **)(wCoord.m_data._8_8_ + 0xb48))(local_9c,"u_sampler");
  (*pcVar2)(uVar4,texCoord_local._4_4_);
  if ((position[0xf]._2_1_ & 1) != 0) {
    tcu::TestLog::operator<<(&local_220,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_220,(char (*) [13])"u_sampler = ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)((long)&texCoord_local + 4));
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_220);
  }
  if ((position[0xf]._3_1_ & 1) != 0) {
    pcVar2 = *(code **)(wCoord.m_data._8_8_ + 0x14e0);
    uVar4 = (**(code **)(wCoord.m_data._8_8_ + 0xb48))(local_9c,"u_bias");
    (*pcVar2)(params->bias,uVar4);
    if ((position[0xf]._2_1_ & 1) != 0) {
      tcu::TestLog::operator<<(&local_3b0,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<(&local_3b0,(char (*) [10])"u_bias = ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&params->bias);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3b0);
    }
  }
  if (params->samplerType == SAMPLERTYPE_SHADOW) {
    pcVar2 = *(code **)(wCoord.m_data._8_8_ + 0x14e0);
    uVar4 = (**(code **)(wCoord.m_data._8_8_ + 0xb48))(local_9c,"u_ref");
    (*pcVar2)(params->ref,uVar4);
    if ((position[0xf]._2_1_ & 1) != 0) {
      tcu::TestLog::operator<<(&local_530,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<(&local_530,(char (*) [9])"u_ref = ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&params->ref);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_530);
    }
  }
  pcVar2 = *(code **)(wCoord.m_data._8_8_ + 0x15a8);
  uVar4 = (**(code **)(wCoord.m_data._8_8_ + 0xb48))(local_9c,"u_colorScale");
  pfVar5 = tcu::Vector<float,_4>::getPtr(&params->colorScale);
  (*pcVar2)(uVar4,1,pfVar5);
  pcVar2 = *(code **)(wCoord.m_data._8_8_ + 0x15a8);
  uVar4 = (**(code **)(wCoord.m_data._8_8_ + 0xb48))(local_9c,"u_colorBias");
  pfVar5 = tcu::Vector<float,_4>::getPtr(&params->colorBias);
  (*pcVar2)(uVar4,1,pfVar5);
  if ((position[0xf]._2_1_ & 1) != 0) {
    tcu::TestLog::operator<<(&local_6b0,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_6b0,(char (*) [16])"u_colorScale = ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&params->colorScale);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_6b0);
    tcu::TestLog::operator<<(&local_830,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_830,(char (*) [15])"u_colorBias = ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&params->colorBias);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_830);
  }
  dVar3 = (**(code **)(wCoord.m_data._8_8_ + 0x800))();
  glu::checkError(dVar3,"Set program state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureTestUtil.cpp"
                  ,0x1d7);
  local_92a = 1;
  local_8e0 = (void **)local_8d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_900,"a_position",&local_901);
  glu::va::Float((VertexArrayBinding *)local_8d8,&local_900,4,4,0,(float *)&numComps);
  __return_storage_ptr__ = &vertexArrays[0].pointer.data;
  local_8e0 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_928,"a_texCoord",&local_929);
  glu::va::Float((VertexArrayBinding *)__return_storage_ptr__,&local_928,(int)program,4,0,texCoord);
  local_92a = 0;
  std::__cxx11::string::~string((string *)&local_928);
  std::allocator<char>::~allocator(&local_929);
  std::__cxx11::string::~string((string *)&local_900);
  std::allocator<char>::~allocator(&local_901);
  dVar3 = local_9c;
  context = this->m_renderCtx;
  glu::pr::Triangles(&local_948,6,renderQuad::indices);
  glu::draw(context,dVar3,2,(VertexArrayBinding *)local_8d8,&local_948,(DrawUtilCallback *)0x0);
  local_a78 = (VertexArrayBinding *)&vertexArrays[1].pointer.data;
  do {
    local_a78 = local_a78 + -1;
    glu::VertexArrayBinding::~VertexArrayBinding(local_a78);
  } while (local_a78 != (VertexArrayBinding *)local_8d8);
  return;
}

Assistant:

void TextureRenderer::renderQuad (int texUnit, const float* texCoord, const RenderParams& params)
{
	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	tcu::Vec4				wCoord		= params.flags & RenderParams::PROJECTED ? params.w : tcu::Vec4(1.0f);
	bool					useBias		= !!(params.flags & RenderParams::USE_BIAS);
	bool					logUniforms	= !!(params.flags & RenderParams::LOG_UNIFORMS);

	// Render quad with texture.
	float position[] =
	{
		-1.0f*wCoord.x(), -1.0f*wCoord.x(), 0.0f, wCoord.x(),
		-1.0f*wCoord.y(), +1.0f*wCoord.y(), 0.0f, wCoord.y(),
		+1.0f*wCoord.z(), -1.0f*wCoord.z(), 0.0f, wCoord.z(),
		+1.0f*wCoord.w(), +1.0f*wCoord.w(), 0.0f, wCoord.w()
	};
	static const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

	Program progSpec	= PROGRAM_LAST;
	int		numComps	= 0;
	if (params.texType == TEXTURETYPE_2D)
	{
		numComps = 2;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = useBias ? PROGRAM_2D_FLOAT_BIAS	: PROGRAM_2D_FLOAT;		break;
			case SAMPLERTYPE_INT:		progSpec = useBias ? PROGRAM_2D_INT_BIAS	: PROGRAM_2D_INT;		break;
			case SAMPLERTYPE_UINT:		progSpec = useBias ? PROGRAM_2D_UINT_BIAS	: PROGRAM_2D_UINT;		break;
			case SAMPLERTYPE_SHADOW:	progSpec = useBias ? PROGRAM_2D_SHADOW_BIAS	: PROGRAM_2D_SHADOW;	break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_1D)
	{
		numComps = 1;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = useBias ? PROGRAM_1D_FLOAT_BIAS	: PROGRAM_1D_FLOAT;		break;
			case SAMPLERTYPE_INT:		progSpec = useBias ? PROGRAM_1D_INT_BIAS	: PROGRAM_1D_INT;		break;
			case SAMPLERTYPE_UINT:		progSpec = useBias ? PROGRAM_1D_UINT_BIAS	: PROGRAM_1D_UINT;		break;
			case SAMPLERTYPE_SHADOW:	progSpec = useBias ? PROGRAM_1D_SHADOW_BIAS	: PROGRAM_1D_SHADOW;	break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_CUBE)
	{
		numComps = 3;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = useBias ? PROGRAM_CUBE_FLOAT_BIAS	: PROGRAM_CUBE_FLOAT;	break;
			case SAMPLERTYPE_INT:		progSpec = useBias ? PROGRAM_CUBE_INT_BIAS		: PROGRAM_CUBE_INT;		break;
			case SAMPLERTYPE_UINT:		progSpec = useBias ? PROGRAM_CUBE_UINT_BIAS		: PROGRAM_CUBE_UINT;	break;
			case SAMPLERTYPE_SHADOW:	progSpec = useBias ? PROGRAM_CUBE_SHADOW_BIAS	: PROGRAM_CUBE_SHADOW;	break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_3D)
	{
		numComps = 3;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = useBias ? PROGRAM_3D_FLOAT_BIAS	: PROGRAM_3D_FLOAT;		break;
			case SAMPLERTYPE_INT:		progSpec = useBias ? PROGRAM_3D_INT_BIAS	: PROGRAM_3D_INT;		break;
			case SAMPLERTYPE_UINT:		progSpec = useBias ? PROGRAM_3D_UINT_BIAS	: PROGRAM_3D_UINT;		break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_2D_ARRAY)
	{
		DE_ASSERT(!useBias); // \todo [2012-02-17 pyry] Support bias.

		numComps = 3;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = PROGRAM_2D_ARRAY_FLOAT;	break;
			case SAMPLERTYPE_INT:		progSpec = PROGRAM_2D_ARRAY_INT;	break;
			case SAMPLERTYPE_UINT:		progSpec = PROGRAM_2D_ARRAY_UINT;	break;
			case SAMPLERTYPE_SHADOW:	progSpec = PROGRAM_2D_ARRAY_SHADOW;	break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_CUBE_ARRAY)
	{
		DE_ASSERT(!useBias);

		numComps = 4;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = PROGRAM_CUBE_ARRAY_FLOAT;	break;
			case SAMPLERTYPE_INT:		progSpec = PROGRAM_CUBE_ARRAY_INT;		break;
			case SAMPLERTYPE_UINT:		progSpec = PROGRAM_CUBE_ARRAY_UINT;		break;
			case SAMPLERTYPE_SHADOW:	progSpec = PROGRAM_CUBE_ARRAY_SHADOW;	break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_1D_ARRAY)
	{
		DE_ASSERT(!useBias); // \todo [2012-02-17 pyry] Support bias.

		numComps = 2;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FLOAT:		progSpec = PROGRAM_1D_ARRAY_FLOAT;	break;
			case SAMPLERTYPE_INT:		progSpec = PROGRAM_1D_ARRAY_INT;	break;
			case SAMPLERTYPE_UINT:		progSpec = PROGRAM_1D_ARRAY_UINT;	break;
			case SAMPLERTYPE_SHADOW:	progSpec = PROGRAM_1D_ARRAY_SHADOW;	break;
			default:					DE_ASSERT(false);
		}
	}
	else if (params.texType == TEXTURETYPE_BUFFER)
	{
		numComps = 1;

		switch (params.samplerType)
		{
			case SAMPLERTYPE_FETCH_FLOAT:	progSpec = PROGRAM_BUFFER_FLOAT;	break;
			case SAMPLERTYPE_FETCH_INT:		progSpec = PROGRAM_BUFFER_INT;		break;
			case SAMPLERTYPE_FETCH_UINT:	progSpec = PROGRAM_BUFFER_UINT;		break;
			default:						DE_ASSERT(false);
		}
	}
	else
		DE_ASSERT(DE_FALSE);

	glu::ShaderProgram* program = m_programLibrary.getProgram(progSpec);

	// \todo [2012-09-26 pyry] Move to ProgramLibrary and log unique programs only(?)
	if (params.flags & RenderParams::LOG_PROGRAMS)
		m_log << *program;

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set vertex attributes");

	// Program and uniforms.
	deUint32 prog = program->getProgram();
	gl.useProgram(prog);

	gl.uniform1i(gl.getUniformLocation(prog, "u_sampler"), texUnit);
	if (logUniforms)
		m_log << TestLog::Message << "u_sampler = " << texUnit << TestLog::EndMessage;

	if (useBias)
	{
		gl.uniform1f(gl.getUniformLocation(prog, "u_bias"), params.bias);
		if (logUniforms)
			m_log << TestLog::Message << "u_bias = " << params.bias << TestLog::EndMessage;
	}

	if (params.samplerType == SAMPLERTYPE_SHADOW)
	{
		gl.uniform1f(gl.getUniformLocation(prog, "u_ref"), params.ref);
		if (logUniforms)
			m_log << TestLog::Message << "u_ref = " << params.ref << TestLog::EndMessage;
	}

	gl.uniform4fv(gl.getUniformLocation(prog, "u_colorScale"),	1, params.colorScale.getPtr());
	gl.uniform4fv(gl.getUniformLocation(prog, "u_colorBias"),	1, params.colorBias.getPtr());

	if (logUniforms)
	{
		m_log << TestLog::Message << "u_colorScale = " << params.colorScale << TestLog::EndMessage;
		m_log << TestLog::Message << "u_colorBias = " << params.colorBias << TestLog::EndMessage;
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set program state");

	{
		const glu::VertexArrayBinding vertexArrays[] =
		{
			glu::va::Float("a_position",	4,			4, 0, &position[0]),
			glu::va::Float("a_texCoord",	numComps,	4, 0, texCoord)
		};
		glu::draw(m_renderCtx, prog, DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
	}
}